

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O0

void colorToRegistersChange
               (AssemblyCommands *commands,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *tempToColorMap,RegisterInfo *registerInfo)

{
  bool bVar1;
  reference psVar2;
  element_type *peVar3;
  undefined1 local_48 [8];
  shared_ptr<AssemblyCode::AssemblyCommand> entry;
  iterator __end1;
  iterator __begin1;
  AssemblyCommands *__range1;
  RegisterInfo *registerInfo_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *tempToColorMap_local;
  AssemblyCommands *commands_local;
  
  __end1 = std::
           vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
           ::begin(commands);
  entry.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
          ::end(commands);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
                                *)&entry.
                                   super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<AssemblyCode::AssemblyCommand>::shared_ptr
              ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_48,psVar2);
    peVar3 = std::
             __shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    (*peVar3->_vptr_AssemblyCommand[3])(peVar3,tempToColorMap,registerInfo);
    std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
              ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_48);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void colorToRegistersChange(AssemblyCommands& commands,
                            std::map<std::string, int>& tempToColorMap,
                            AssemblyCode::RegisterInfo& registerInfo) {
    for (auto entry : commands) {
        entry->colorToRegisterChange(tempToColorMap, registerInfo);
    }
}